

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O2

int bsp_find_closest_points(void *handle,float *point,float radius,int **pointarray)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  bsp_find_points(handle,point,radius,pointarray);
  uVar1 = array_count(*pointarray);
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  fVar6 = 3.4028235e+38;
  iVar3 = -1;
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    fVar7 = 0.0;
    for (uVar5 = 0; *(byte *)((long)handle + 8) != uVar5; uVar5 = uVar5 + 1) {
      fVar8 = point[uVar5] -
              *(float *)(*(long *)(*handle + uVar5 * 8) + (long)(*pointarray)[uVar4] * 4);
      fVar7 = fVar7 + fVar8 * fVar8;
    }
    if (fVar7 < fVar6) {
      iVar3 = (*pointarray)[uVar4];
      fVar6 = fVar7;
    }
  }
  return iVar3;
}

Assistant:

int
bsp_find_closest_points(
    void * handle,
    float * point,
    float radius,
    int ** pointarray )
{
    bsp_tree * tree;
    int d, i, cnt, closest;
    float bestradius;

    tree = (bsp_tree *) handle;
    assert( tree != NULL );

    bsp_find_points( tree, point, radius, pointarray );

    cnt = array_count( pointarray[0] );
    closest = -1;
    bestradius = FLT_MAX;
    for ( i = 0; i < cnt; i++ ) {
        radius = 0.0f;
        for ( d = 0; d < tree->dimensions; d++ ) {
            float diff;
            diff = point[d] - tree->pointarrays[d][pointarray[0][i]];
            radius += diff * diff;
        }
        if ( radius < bestradius ) {
            closest = pointarray[0][i];
            bestradius = radius;
        }
    }

    return closest;
}